

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> * __thiscall
NavierStokesBase::fetchBCArray(NavierStokesBase *this,int State_Type,int scomp,int ncomp)

{
  Box *this_00;
  StateData *this_01;
  BCRec *pBVar1;
  StateDescriptor *pSVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  long in_RSI;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_RDI;
  int in_R8D;
  int n;
  Box *domain;
  StateDescriptor *stDesc;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bc;
  int dir;
  int *dhi;
  int *dlo;
  int *bxhi;
  int *bxlo;
  undefined4 in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffecc;
  StateDescriptor *in_stack_fffffffffffffed0;
  uint local_124;
  int local_cc;
  int local_84;
  
  std::allocator<amrex::BCRec>::allocator((allocator<amrex::BCRec> *)0x51543e);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffed0,
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (allocator_type *)0x515452);
  std::allocator<amrex::BCRec>::~allocator((allocator<amrex::BCRec> *)0x515461);
  this_00 = amrex::Geometry::Domain((Geometry *)(in_RSI + 0x10));
  for (local_cc = 0; local_cc < in_R8D; local_cc = local_cc + 1) {
    this_01 = amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                        ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                         in_stack_fffffffffffffed0,
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    amrex::StateData::descriptor(this_01);
    pBVar1 = amrex::StateDescriptor::getBC(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    pSVar2 = (StateDescriptor *)
             amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator[]
                       ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                        in_stack_fffffffffffffed0,
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    piVar3 = amrex::Box::loVect(this_00);
    piVar4 = amrex::Box::hiVect(this_00);
    piVar5 = amrex::Box::loVect(this_00);
    piVar6 = amrex::Box::hiVect(this_00);
    for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
      if (piVar5[local_84] < piVar3[local_84]) {
        local_124 = 0;
      }
      else {
        local_124 = pBVar1->bc[local_84];
      }
      (&pSVar2->type)[local_84].itype = local_124;
      if (piVar4[local_84] < piVar6[local_84]) {
        in_stack_fffffffffffffecc = 0;
      }
      else {
        in_stack_fffffffffffffecc = pBVar1->bc[local_84 + 3];
      }
      (&pSVar2->type)[local_84 + 3].itype = in_stack_fffffffffffffecc;
      in_stack_fffffffffffffed0 = pSVar2;
    }
  }
  return in_RDI;
}

Assistant:

Vector<BCRec>
NavierStokesBase::fetchBCArray (int State_Type, int scomp, int ncomp)
{
    Vector<BCRec> bc(ncomp);
    const StateDescriptor* stDesc;
    const Box& domain = geom.Domain();

    for (int n(0); n < ncomp; ++n)
    {
      stDesc=state[State_Type].descriptor();
      setBC(domain,domain,stDesc->getBC(scomp+n), bc[n] );
    }

    return bc;
}